

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget.cpp
# Opt level: O3

QSizeF __thiscall QGraphicsWidget::sizeHint(QGraphicsWidget *this,SizeHint which,QSizeF *constraint)

{
  QGraphicsLayoutItem *this_00;
  double *pdVar1;
  long in_FS_OFFSET;
  double dVar2;
  double dVar3;
  QSizeF QVar4;
  QSizeF local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsLayoutItem **)(*(long *)(this + 0x18) + 0x180);
  if (this_00 == (QGraphicsLayoutItem *)0x0) {
    if (which < MinimumDescent) {
      dVar2 = *(double *)(&DAT_006f6368 + (ulong)which * 8);
      dVar3 = dVar2;
    }
    else {
      sizeHint();
      dVar2 = -1.0;
      dVar3 = -1.0;
    }
  }
  else {
    pdVar1 = *(double **)(*(long *)(this + 0x18) + 0x178);
    if (pdVar1 == (double *)0x0) {
      dVar2 = 0.0;
      dVar3 = 0.0;
    }
    else {
      dVar2 = pdVar1[2] + *pdVar1;
      dVar3 = pdVar1[3] + pdVar1[1];
    }
    local_18.wd = constraint->wd - dVar2;
    local_18.ht = constraint->ht - dVar3;
    QVar4 = QGraphicsLayoutItem::effectiveSizeHint(this_00,which,&local_18);
    dVar2 = QVar4.wd + dVar2;
    dVar3 = QVar4.ht + dVar3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    QVar4.ht = dVar3;
    QVar4.wd = dVar2;
    return QVar4;
  }
  __stack_chk_fail();
}

Assistant:

QSizeF QGraphicsWidget::sizeHint(Qt::SizeHint which, const QSizeF &constraint) const
{
    Q_D(const QGraphicsWidget);
    QSizeF sh;
    if (d->layout) {
        QSizeF marginSize(0,0);
        if (d->margins) {
            marginSize = QSizeF(d->margins->left() + d->margins->right(),
                         d->margins->top() + d->margins->bottom());
        }
        sh = d->layout->effectiveSizeHint(which, constraint - marginSize);
        sh += marginSize;
    } else {
        switch (which) {
            case Qt::MinimumSize:
                sh = QSizeF(0, 0);
                break;
            case Qt::PreferredSize:
                sh = QSizeF(50, 50);    //rather arbitrary
                break;
            case Qt::MaximumSize:
                sh = QSizeF(QWIDGETSIZE_MAX, QWIDGETSIZE_MAX);
                break;
            default:
                qWarning("QGraphicsWidget::sizeHint(): Don't know how to handle the value of 'which'");
                break;
        }
    }
    return sh;
}